

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::RemoveRPath(string *file,string *emsg,bool *removed)

{
  vector<char,_std::allocator<char>_> *this;
  bool bVar1;
  byte bVar2;
  uint index;
  _Ios_Openmode _Var3;
  char *pcVar4;
  StringEntry *pSVar5;
  unsigned_long uVar6;
  long *plVar7;
  reference pvVar8;
  ulong local_378;
  unsigned_long j;
  __mbstate_t local_368;
  int local_35c;
  undefined1 auStack_358 [4];
  int i_3;
  __mbstate_t local_350;
  undefined1 local_348 [8];
  ofstream f;
  unsigned_long sz;
  reference pvStack_138;
  int i_2;
  char *data;
  unsigned_long local_128;
  unsigned_long bytesEnd;
  int i_1;
  unsigned_long entryEnd [2];
  unsigned_long entryBegin [3];
  int local_e4;
  int i;
  uint count;
  StringEntry *se_runpath;
  StringEntry *se_rpath;
  StringEntry *se [2];
  uint local_b0;
  int se_count;
  undefined1 local_a0 [8];
  cmELF elf;
  vector<char,_std::allocator<char>_> bytes;
  unsigned_long bytesBegin;
  unsigned_long zeroSize [2];
  unsigned_long zeroPosition [2];
  uint local_2c;
  int zeroCount;
  bool *removed_local;
  string *emsg_local;
  string *file_local;
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  local_2c = 0;
  zeroSize[1] = 0;
  zeroSize[0] = 0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)((long)&elf.ErrorMessage.field_2 + 8));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmELF::cmELF((cmELF *)local_a0,pcVar4);
  se_rpath = (StringEntry *)0x0;
  se[0] = (StringEntry *)0x0;
  pSVar5 = cmELF::GetRPath((cmELF *)local_a0);
  if (pSVar5 != (StringEntry *)0x0) {
    se_rpath = pSVar5;
  }
  local_b0 = (uint)(pSVar5 != (StringEntry *)0x0);
  pSVar5 = cmELF::GetRunPath((cmELF *)local_a0);
  if (pSVar5 != (StringEntry *)0x0) {
    se[(long)(int)local_b0 + -1] = pSVar5;
    local_b0 = local_b0 + 1;
  }
  if (local_b0 == 0) {
    file_local._7_1_ = 1;
    bVar1 = true;
  }
  else {
    if ((local_b0 == 2) && (se[0]->IndexInSection < se_rpath->IndexInSection)) {
      std::swap<cmELF::StringEntry_const*>(&se_rpath,se);
    }
    index = cmELF::GetDynamicEntryCount((cmELF *)local_a0);
    if (index == 0) {
      if (emsg != (string *)0x0) {
        std::__cxx11::string::operator=
                  ((string *)emsg,"DYNAMIC section contains a DT_NULL before the end.");
      }
      file_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      local_2c = local_b0;
      for (local_e4 = 0; local_e4 < (int)local_b0; local_e4 = local_e4 + 1) {
        zeroSize[(long)local_e4 + 1] = se[(long)local_e4 + -1]->Position;
        zeroSize[(long)local_e4 + -1] = se[(long)local_e4 + -1]->Size;
      }
      memset(entryEnd + 1,0,0x18);
      memset(&stack0xfffffffffffffee8,0,0x10);
      for (bytesEnd._4_4_ = 0; bytesEnd._4_4_ < (int)local_b0; bytesEnd._4_4_ = bytesEnd._4_4_ + 1)
      {
        uVar6 = cmELF::GetDynamicEntryPosition
                          ((cmELF *)local_a0,se[(long)bytesEnd._4_4_ + -1]->IndexInSection);
        entryEnd[(long)bytesEnd._4_4_ + 1] = uVar6;
        uVar6 = cmELF::GetDynamicEntryPosition
                          ((cmELF *)local_a0,se[(long)bytesEnd._4_4_ + -1]->IndexInSection + 1);
        *(unsigned_long *)(&stack0xfffffffffffffee8 + (long)bytesEnd._4_4_ * 8) = uVar6;
      }
      uVar6 = cmELF::GetDynamicEntryPosition((cmELF *)local_a0,index);
      entryEnd[(long)(int)local_b0 + 1] = uVar6;
      bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = entryEnd[1];
      local_128 = entryEnd[(long)(int)local_b0 + 1];
      data._7_1_ = 0;
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)((long)&elf.ErrorMessage.field_2 + 8),
                 local_128 - entryEnd[1],(value_type_conflict1 *)((long)&data + 7));
      pvStack_138 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)
                               ((long)&elf.ErrorMessage.field_2 + 8),0);
      for (sz._4_4_ = 0; sz._4_4_ < (int)local_b0; sz._4_4_ = sz._4_4_ + 1) {
        f._504_8_ = entryEnd[(long)(sz._4_4_ + 1) + 1] -
                    *(long *)(&stack0xfffffffffffffee8 + (long)sz._4_4_ * 8);
        if (f._504_8_ != 0) {
          bVar1 = cmELF::ReadBytes((cmELF *)local_a0,
                                   *(unsigned_long *)(&stack0xfffffffffffffee8 + (long)sz._4_4_ * 8)
                                   ,f._504_8_,pvStack_138);
          if (!bVar1) {
            if (emsg != (string *)0x0) {
              std::__cxx11::string::operator=
                        ((string *)emsg,"Failed to read DYNAMIC section header.");
            }
            file_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_00458f62;
          }
        }
        pvStack_138 = pvStack_138 + f._504_8_;
      }
      bVar1 = false;
    }
  }
LAB_00458f62:
  cmELF::~cmELF((cmELF *)local_a0);
  if (!bVar1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    _Var3 = std::operator|(_S_in,_S_out);
    _Var3 = std::operator|(_Var3,_S_bin);
    std::ofstream::ofstream(local_348,pcVar4,_Var3);
    bVar2 = std::ios::operator!((ios *)(local_348 + (long)*(_func_int **)((long)local_348 + -0x18)))
    ;
    if ((bVar2 & 1) == 0) {
      std::fpos<__mbstate_t>::fpos
                ((fpos<__mbstate_t> *)auStack_358,
                 bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
      plVar7 = (long *)std::ostream::seekp(local_348,_auStack_358,local_350);
      bVar2 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
      if ((bVar2 & 1) == 0) {
        this = (vector<char,_std::allocator<char>_> *)((long)&elf.ErrorMessage.field_2 + 8);
        pvVar8 = std::vector<char,_std::allocator<char>_>::operator[](this,0);
        std::vector<char,_std::allocator<char>_>::size(this);
        plVar7 = (long *)std::ostream::write(local_348,(long)pvVar8);
        bVar2 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
        if ((bVar2 & 1) == 0) {
          for (local_35c = 0; local_35c < (int)local_2c; local_35c = local_35c + 1) {
            std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&j,zeroSize[(long)local_35c + 1]);
            plVar7 = (long *)std::ostream::seekp(local_348,j,local_368);
            bVar2 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
            if ((bVar2 & 1) != 0) {
              if (emsg != (string *)0x0) {
                std::__cxx11::string::operator=((string *)emsg,"Error seeking to RPATH position.");
              }
              file_local._7_1_ = 0;
              goto LAB_004592fd;
            }
            for (local_378 = 0; local_378 < zeroSize[(long)local_35c + -1];
                local_378 = local_378 + 1) {
              std::operator<<((ostream *)local_348,'\0');
            }
            bVar2 = std::ios::operator!((ios *)(local_348 +
                                               (long)*(_func_int **)((long)local_348 + -0x18)));
            if ((bVar2 & 1) != 0) {
              if (emsg != (string *)0x0) {
                std::__cxx11::string::operator=
                          ((string *)emsg,"Error writing the empty rpath string to the file.");
              }
              file_local._7_1_ = 0;
              goto LAB_004592fd;
            }
          }
          if (removed != (bool *)0x0) {
            *removed = true;
          }
          file_local._7_1_ = 1;
        }
        else {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::operator=((string *)emsg,"Error replacing DYNAMIC table header.");
          }
          file_local._7_1_ = 0;
        }
      }
      else {
        if (emsg != (string *)0x0) {
          std::__cxx11::string::operator=
                    ((string *)emsg,"Error seeking to DYNAMIC table header for RPATH.");
        }
        file_local._7_1_ = 0;
      }
    }
    else {
      if (emsg != (string *)0x0) {
        std::__cxx11::string::operator=((string *)emsg,"Error opening file for update.");
      }
      file_local._7_1_ = 0;
    }
LAB_004592fd:
    std::ofstream::~ofstream(local_348);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)((long)&elf.ErrorMessage.field_2 + 8));
  return (bool)(file_local._7_1_ & 1);
}

Assistant:

bool cmSystemTools::RemoveRPath(std::string const& file, std::string* emsg,
                                bool* removed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if(removed)
    {
    *removed = false;
    }
  int zeroCount = 0;
  unsigned long zeroPosition[2] = {0,0};
  unsigned long zeroSize[2] = {0,0};
  unsigned long bytesBegin = 0;
  std::vector<char> bytes;
  {
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH and RUNPATH entries from it and sort them by index
  // in the dynamic section header.
  int se_count = 0;
  cmELF::StringEntry const* se[2] = {0, 0};
  if(cmELF::StringEntry const* se_rpath = elf.GetRPath())
    {
    se[se_count++] = se_rpath;
    }
  if(cmELF::StringEntry const* se_runpath = elf.GetRunPath())
    {
    se[se_count++] = se_runpath;
    }
  if(se_count == 0)
    {
    // There is no RPATH or RUNPATH anyway.
    return true;
    }
  if(se_count == 2 && se[1]->IndexInSection < se[0]->IndexInSection)
    {
    std::swap(se[0], se[1]);
    }

  // Get the size of the dynamic section header.
  unsigned int count = elf.GetDynamicEntryCount();
  if(count == 0)
    {
    // This should happen only for invalid ELF files where a DT_NULL
    // appears before the end of the table.
    if(emsg)
      {
      *emsg = "DYNAMIC section contains a DT_NULL before the end.";
      }
    return false;
    }

  // Save information about the string entries to be zeroed.
  zeroCount = se_count;
  for(int i=0; i < se_count; ++i)
    {
    zeroPosition[i] = se[i]->Position;
    zeroSize[i] = se[i]->Size;
    }

  // Get the range of file positions corresponding to each entry and
  // the rest of the table after them.
  unsigned long entryBegin[3] = {0,0,0};
  unsigned long entryEnd[2] = {0,0};
  for(int i=0; i < se_count; ++i)
    {
    entryBegin[i] = elf.GetDynamicEntryPosition(se[i]->IndexInSection);
    entryEnd[i] = elf.GetDynamicEntryPosition(se[i]->IndexInSection+1);
    }
  entryBegin[se_count] = elf.GetDynamicEntryPosition(count);

  // The data are to be written over the old table entries starting at
  // the first one being removed.
  bytesBegin = entryBegin[0];
  unsigned long bytesEnd = entryBegin[se_count];

  // Allocate a buffer to hold the part of the file to be written.
  // Initialize it with zeros.
  bytes.resize(bytesEnd - bytesBegin, 0);

  // Read the part of the DYNAMIC section header that will move.
  // The remainder of the buffer will be left with zeros which
  // represent a DT_NULL entry.
  char* data = &bytes[0];
  for(int i=0; i < se_count; ++i)
    {
    // Read data between the entries being removed.
    unsigned long sz = entryBegin[i+1] - entryEnd[i];
    if(sz > 0 && !elf.ReadBytes(entryEnd[i], sz, data))
      {
      if(emsg)
        {
        *emsg = "Failed to read DYNAMIC section header.";
        }
      return false;
      }
    data += sz;
    }
  }

  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                  std::ios::in | std::ios::out | std::ios::binary);
  if(!f)
    {
    if(emsg)
      {
      *emsg = "Error opening file for update.";
      }
    return false;
    }

  // Write the new DYNAMIC table header.
  if(!f.seekp(bytesBegin))
    {
    if(emsg)
      {
      *emsg = "Error seeking to DYNAMIC table header for RPATH.";
      }
    return false;
    }
  if(!f.write(&bytes[0], bytes.size()))
    {
    if(emsg)
      {
      *emsg = "Error replacing DYNAMIC table header.";
      }
    return false;
    }

  // Fill the RPATH and RUNPATH strings with zero bytes.
  for(int i=0; i < zeroCount; ++i)
    {
    if(!f.seekp(zeroPosition[i]))
      {
      if(emsg)
        {
        *emsg = "Error seeking to RPATH position.";
        }
      return false;
      }
    for(unsigned long j=0; j < zeroSize[i]; ++j)
      {
      f << '\0';
      }
    if(!f)
      {
      if(emsg)
        {
        *emsg = "Error writing the empty rpath string to the file.";
        }
      return false;
      }
    }

  // Everything was updated successfully.
  if(removed)
    {
    *removed = true;
    }
  return true;
#else
  (void)file;
  (void)emsg;
  (void)removed;
  return false;
#endif
}